

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O2

void make_blinded(long xtime,boolean talk)

{
  uint uVar1;
  boolean bVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  char buf [256];
  
  uVar1 = u.uprops[0x1e].intrinsic;
  pcVar6 = buf;
  pcVar4 = buf;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0020da38;
    bVar7 = true;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0020da33;
  }
  else {
LAB_0020da33:
    if (ublindf == (obj *)0x0) {
      bVar7 = false;
    }
    else {
LAB_0020da38:
      bVar7 = ublindf->oartifact == '\x1d';
    }
  }
  if (xtime == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0020da72;
    bVar8 = true;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0020da6d;
  }
  else {
LAB_0020da6d:
    if (ublindf == (obj *)0x0) {
      bVar8 = false;
    }
    else {
LAB_0020da72:
      bVar8 = ublindf->oartifact == '\x1d';
    }
  }
  if (u.usleep != 0) {
    talk = '\0';
  }
  if ((bVar8 == false) || (bVar7 != false)) {
    if ((xtime == 0) && ((u.uprops[0x1e].intrinsic != 0 && (talk != '\0')))) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) {
        if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
          pcVar6 = "normal";
          if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
            if (u.umonnum == u.umonster) {
              pcVar6 = "sadder";
            }
            else {
              bVar2 = dmgtype(youmonst.data,0x24);
              pcVar6 = "normal";
              if (bVar2 == '\0') {
                pcVar6 = "sadder";
              }
            }
          }
          pline("Your vision seems to %s for a moment but is %s now.","brighten",pcVar6);
        }
        else {
          pcVar3 = body_part(1);
          strcpy(buf,pcVar3);
          if ((((youmonst.data)->mflags1 & 0x1000) == 0) &&
             (youmonst.data == mons + 0x1e || youmonst.data == mons + 0x17b)) {
            pcVar3 = "twitches";
          }
          else {
            pcVar6 = makeplural(buf);
            pcVar3 = "twitch";
          }
          pline("Your %s momentarily %s.",pcVar6,pcVar3 + 2);
        }
      }
      else {
        strange_feeling((obj *)0x0,(char *)0x0);
      }
    }
    if ((bVar7 != false) && (bVar8 == false)) {
      if (talk != '\0') {
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((pcVar6 = "Oh, bummer!  Everything is dark!  Help!", u.umonnum != u.umonster &&
            (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
          pcVar6 = "A cloud of darkness falls upon you.";
        }
        pline(pcVar6);
      }
      if (uball != (obj *)0x0) {
        set_bc(0);
      }
      goto LAB_0020de43;
    }
  }
  else {
    if (talk == '\0') goto LAB_0020de43;
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((pcVar6 = "Far out!  Everything is all cosmic again!", u.umonnum != u.umonster &&
        (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
      pcVar6 = "You can see again.";
    }
    pline(pcVar6);
  }
  if (((xtime != 0) && (uVar1 == 0)) && (talk != '\0')) {
    if (((youmonst.data)->mflags1 & 0x1000) == 0) {
      if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
        pcVar6 = "normal";
        if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
          if (u.umonnum == u.umonster) {
            pcVar6 = "happier";
          }
          else {
            bVar2 = dmgtype(youmonst.data,0x24);
            pcVar6 = "normal";
            if (bVar2 == '\0') {
              pcVar6 = "happier";
            }
          }
        }
        pline("Your vision seems to %s for a moment but is %s now.","dim",pcVar6);
      }
      else {
        pcVar6 = body_part(1);
        strcpy(buf,pcVar6);
        if ((((youmonst.data)->mflags1 & 0x1000) == 0) &&
           (youmonst.data == mons + 0x1e || youmonst.data == mons + 0x17b)) {
          pcVar6 = "twitches";
        }
        else {
          pcVar4 = makeplural(buf);
          pcVar6 = "twitch";
        }
        pline("Your %s momentarily %s.",pcVar4,pcVar6);
      }
    }
    else {
      strange_feeling((obj *)0x0,(char *)0x0);
    }
  }
LAB_0020de43:
  lVar5 = 0;
  if (0 < xtime) {
    lVar5 = xtime;
  }
  if (0xfffffe < lVar5) {
    lVar5 = 0xffffff;
  }
  u.uprops[0x1e].intrinsic = (uint)lVar5 | u.uprops[0x1e].intrinsic & 0xff000000;
  if (bVar7 != bVar8) {
    iflags.botl = '\x01';
    vision_full_recalc = '\x01';
    if ((((((youmonst.data == mons + 0x32 ||
            (youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e)) ||
           (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) &&
           u.uprops[0x19].blocked == 0) || (u.uprops[0x40].intrinsic != 0)) ||
        (u.uprops[0x40].extrinsic != 0)) || (((youmonst.data)->mflags3 & 0x100) != 0)) {
      see_monsters();
    }
  }
  return;
}

Assistant:

void make_blinded(long xtime, boolean talk)
{
	long old = Blinded;
	boolean u_could_see, can_see_now;
	int eyecnt;
	char buf[BUFSZ];

	/* we need to probe ahead in case the Eyes of the Overworld
	   are or will be overriding blindness */
	u_could_see = !Blind;
	Blinded = xtime ? 1L : 0L;
	can_see_now = !Blind;
	Blinded = old;		/* restore */

	if (u.usleep) talk = FALSE;

	if (can_see_now && !u_could_see) {	/* regaining sight */
	    if (talk) {
		if (Hallucination)
		    pline("Far out!  Everything is all cosmic again!");
		else
		    pline("You can see again.");
	    }
	} else if (old && !xtime) {
	    /* clearing temporary blindness without toggling blindness */
	    if (talk) {
		if (!haseyes(youmonst.data)) {
		    strange_feeling(NULL, NULL);
		} else if (Blindfolded) {
		    strcpy(buf, body_part(EYE));
		    eyecnt = eyecount(youmonst.data);
		    pline(eyemsg, (eyecnt == 1) ? buf : makeplural(buf),
			 (eyecnt == 1) ? "itches" : "itch");
		} else {	/* Eyes of the Overworld */
		    pline(vismsg, "brighten",
			 Hallucination ? "sadder" : "normal");
		}
	    }
	}

	if (u_could_see && !can_see_now) {	/* losing sight */
	    if (talk) {
		if (Hallucination)
		    pline("Oh, bummer!  Everything is dark!  Help!");
		else
		    pline("A cloud of darkness falls upon you.");
	    }
	    /* Before the hero goes blind, set the ball&chain variables. */
	    if (Punished) set_bc(0);
	} else if (!old && xtime) {
	    /* setting temporary blindness without toggling blindness */
	    if (talk) {
		if (!haseyes(youmonst.data)) {
		    strange_feeling(NULL, NULL);
		} else if (Blindfolded) {
		    strcpy(buf, body_part(EYE));
		    eyecnt = eyecount(youmonst.data);
		    pline(eyemsg, (eyecnt == 1) ? buf : makeplural(buf),
			 (eyecnt == 1) ? "twitches" : "twitch");
		} else {	/* Eyes of the Overworld */
		    pline(vismsg, "dim",
			 Hallucination ? "happier" : "normal");
		}
	    }
	}

	set_itimeout(&Blinded, xtime);

	if (u_could_see ^ can_see_now) {  /* one or the other but not both */
	    iflags.botl = 1;
	    vision_full_recalc = 1;	/* blindness just got toggled */
	    if (Blind_telepat || Infravision) see_monsters();
	}
}